

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

void __thiscall cornerstone::raft_server::rm_srv_from_cluster(raft_server *this,int32 srv_id)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  char *__s;
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *plVar4;
  shared_ptr<cornerstone::log_entry> sVar5;
  ptr<cluster_config> new_conf;
  ptr<log_entry> entry;
  bufptr new_conf_buf;
  unsigned_long *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  ulong local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110 [3];
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> local_f8;
  strfmt<200> local_e8;
  
  local_e8.buf_._0_4_ =
       (*((this->log_store_).super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->_vptr_log_store[2])();
  local_e8.buf_._4_4_ = extraout_var;
  local_118 = ((this->config_).
               super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              log_idx_;
  std::make_shared<cornerstone::cluster_config,unsigned_long,unsigned_long>
            ((unsigned_long *)&local_128,(unsigned_long *)&local_e8);
  peVar3 = (this->config_).
           super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar4 = &peVar3->servers_;
  do {
    do {
      plVar4 = (list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                *)(plVar4->
                  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
      if (plVar4 == &peVar3->servers_) {
        peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_e8.fmt_ =
             "removed a server from configuration and save the configuration to log store at %llu";
        __s = strfmt<200>::fmt<unsigned_long>(&local_e8,*local_128);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,__s,(allocator<char> *)&local_f8);
        (*peVar1->_vptr_logger[3])(peVar1,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        this->config_changing_ = true;
        cluster_config::serialize((cluster_config *)&local_e8);
        local_f8._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>.
        _M_t.super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
        super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
        super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
             (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
             ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->term_;
        local_f8._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>.
        _M_t.super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
        super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl._4_4_ = 2;
        sVar5 = std::
                make_shared<cornerstone::log_entry,unsigned_long,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
                          (&local_118,&local_f8,(log_val_type *)&local_e8);
        peVar2 = (this->log_store_).
                 super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar2->_vptr_log_store[5])
                  (peVar2,&local_118,
                   sVar5.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        request_append_entries(this);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_110);
        std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
                  ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)&local_e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
        return;
      }
    } while (*(int *)(plVar4->
                     super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                     )._M_impl._M_node._M_size == srv_id);
    std::__cxx11::
    list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
    ::push_back((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                 *)(local_128 + 2),
                (value_type *)
                &(plVar4->
                 super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                 )._M_impl._M_node._M_size);
    peVar3 = (this->config_).
             super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while( true );
}

Assistant:

void raft_server::rm_srv_from_cluster(int32 srv_id)
{
    ptr<cluster_config> new_conf = cs_new<cluster_config>(log_store_->next_slot(), config_->get_log_idx());
    for (cluster_config::const_srv_itor it = config_->get_servers().begin(); it != config_->get_servers().end(); ++it)
    {
        if ((*it)->get_id() != srv_id)
        {
            new_conf->get_servers().push_back(*it);
        }
    }

    l_->info(lstrfmt("removed a server from configuration and save the configuration to log store at %llu")
                 .fmt(new_conf->get_log_idx()));
    config_changing_ = true;
    bufptr new_conf_buf(new_conf->serialize());
    ptr<log_entry> entry(cs_new<log_entry>(state_->get_term(), std::move(new_conf_buf), log_val_type::conf));
    log_store_->append(entry);
    request_append_entries();
}